

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.hpp
# Opt level: O2

vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
* Tile<Color>::generate_action_map
            (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *__return_storage_ptr__,Symmetry *symmetry)

{
  size_t a_1;
  size_t i;
  size_type sVar1;
  long lVar2;
  pointer pvVar3;
  size_t i_2;
  size_type __n;
  allocator_type local_62;
  allocator_type local_61;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rotation_map;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reflection_map;
  
  generate_rotation_map(&rotation_map,symmetry);
  generate_reflection_map(&reflection_map,symmetry);
  __n = (long)rotation_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)rotation_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,__n,&local_61);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(__return_storage_ptr__,8,(value_type *)&local_48,&local_62);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  pvVar3 = (__return_storage_ptr__->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
    *(int *)(*(long *)&(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data + sVar1 * 4) = (int)sVar1;
  }
  for (lVar2 = 1;
      pvVar3 = (__return_storage_ptr__->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start, lVar2 != 4; lVar2 = lVar2 + 1) {
    for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
      *(uint *)(*(long *)&pvVar3[lVar2].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
               sVar1 * 4) =
           rotation_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start
           [*(uint *)(*(long *)&(pvVar3 + lVar2)[-1].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl + sVar1 * 4)];
    }
  }
  for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
    *(uint *)(*(long *)&pvVar3[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data + sVar1 * 4) =
         reflection_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start
         [*(uint *)(*(long *)&(pvVar3->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data + sVar1 * 4)];
  }
  for (lVar2 = 5; lVar2 != 8; lVar2 = lVar2 + 1) {
    pvVar3 = (__return_storage_ptr__->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + lVar2;
    for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
      *(uint *)(*(long *)&(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data + sVar1 * 4) =
           rotation_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start
           [*(uint *)(*(long *)&pvVar3[-1].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data + sVar1 * 4)];
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&reflection_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&rotation_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::vector<unsigned>>
		generate_action_map(const Symmetry &symmetry) noexcept {
		std::vector<unsigned> rotation_map = generate_rotation_map(symmetry);
		std::vector<unsigned> reflection_map = generate_reflection_map(symmetry);
		size_t size = rotation_map.size();
		std::vector<std::vector<unsigned>> action_map(8,
			std::vector<unsigned>(size));
		for (size_t i = 0; i < size; ++i) {
			action_map[0][i] = i;
		}

		for (size_t a = 1; a < 4; ++a) {
			for (size_t i = 0; i < size; ++i) {
				action_map[a][i] = rotation_map[action_map[a - 1][i]];
			}
		}
		for (size_t i = 0; i < size; ++i) {
			action_map[4][i] = reflection_map[action_map[0][i]];
		}
		for (size_t a = 5; a < 8; ++a) {
			for (size_t i = 0; i < size; ++i) {
				action_map[a][i] = rotation_map[action_map[a - 1][i]];
			}
		}
		return action_map;
	}